

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O3

int Ssw_ObjSatNum(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = (int)pObj;
  iVar2 = *(int *)((long)&p->pAig + 4);
  if (iVar5 < iVar2) goto LAB_005f7b22;
  iVar4 = iVar5 + 1;
  iVar1 = *(int *)&p->pAig;
  if (iVar5 < iVar1 * 2) {
    if (iVar1 <= iVar5) {
      if (*(void **)&p->fPolarFlip == (void *)0x0) {
        pvVar3 = malloc((long)iVar1 << 3);
      }
      else {
        pvVar3 = realloc(*(void **)&p->fPolarFlip,(long)iVar1 << 3);
      }
      *(void **)&p->fPolarFlip = pvVar3;
      iVar2 = iVar1 * 2;
LAB_005f7af2:
      if (pvVar3 == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *(int *)&p->pAig = iVar2;
      iVar2 = *(int *)((long)&p->pAig + 4);
    }
  }
  else if (iVar1 <= iVar5) {
    if (*(void **)&p->fPolarFlip == (void *)0x0) {
      pvVar3 = malloc((long)iVar4 << 2);
    }
    else {
      pvVar3 = realloc(*(void **)&p->fPolarFlip,(long)iVar4 << 2);
    }
    *(void **)&p->fPolarFlip = pvVar3;
    iVar2 = iVar4;
    goto LAB_005f7af2;
  }
  if (iVar2 <= iVar5) {
    memset((void *)((long)iVar2 * 4 + *(long *)&p->fPolarFlip),0,
           (ulong)(uint)(iVar5 - iVar2) * 4 + 4);
  }
  *(int *)((long)&p->pAig + 4) = iVar4;
  iVar2 = iVar4;
LAB_005f7b22:
  if ((-1 < iVar5) && (iVar5 < iVar2)) {
    return *(int *)(*(long *)&p->fPolarFlip + ((ulong)pObj & 0xffffffff) * 4);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int  Ssw_ObjSatNum( Ssw_Sat_t * p, Aig_Obj_t * pObj )             { return Vec_IntGetEntry( p->vSatVars, pObj->Id );  }